

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManFromIfLogicCreateLutSpecial
              (Gia_Man_t *pNew,word *pRes,Vec_Int_t *vLeaves,Vec_Int_t *vLeavesTemp,
              Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2,Vec_Int_t *vPacking)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int v_1;
  int v;
  int iObjLit2;
  int iObjLit1;
  int i;
  word Truth;
  word z;
  Vec_Int_t *vMapping_local;
  Vec_Int_t *vCover_local;
  Vec_Int_t *vLeavesTemp_local;
  Vec_Int_t *vLeaves_local;
  word *pRes_local;
  Gia_Man_t *pNew_local;
  
  z = (word)vMapping;
  vMapping_local = vCover;
  vCover_local = vLeavesTemp;
  vLeavesTemp_local = vLeaves;
  vLeaves_local = (Vec_Int_t *)pRes;
  pRes_local = (word *)pNew;
  iVar2 = Vec_IntSize(vLeaves);
  iVar3 = Vec_IntSize(vLeavesTemp_local);
  Truth = If_CutPerformDerive07((If_Man_t *)0x0,(uint *)pRes,iVar2,iVar3,(char *)0x0);
  Vec_IntClear(vCover_local);
  for (iObjLit2 = 0; iObjLit2 < 4; iObjLit2 = iObjLit2 + 1) {
    uVar4 = (uint)(Truth >> ((char)(iObjLit2 << 2) + 0x10U & 0x3f)) & 7;
    if ((uVar4 != 6) || (iVar2 = Vec_IntSize(vLeavesTemp_local), iVar2 != 5)) {
      pVVar1 = vCover_local;
      iVar2 = Vec_IntEntry(vLeavesTemp_local,uVar4);
      Vec_IntPush(pVVar1,iVar2);
    }
  }
  _iObjLit1 = (Truth & 0xffff) << 0x10 | Truth & 0xffff;
  _iObjLit1 = _iObjLit1 << 0x20 | _iObjLit1;
  iVar2 = Gia_ManFromIfLogicCreateLut
                    ((Gia_Man_t *)pRes_local,(word *)&iObjLit1,vCover_local,vMapping_local,
                     (Vec_Int_t *)z,vMapping2);
  Vec_IntClear(vCover_local);
  for (iObjLit2 = 0; iObjLit2 < 4; iObjLit2 = iObjLit2 + 1) {
    uVar4 = (uint)(Truth >> ((char)(iObjLit2 << 2) + 0x30U & 0x3f)) & 7;
    if ((uVar4 != 6) || (iVar3 = Vec_IntSize(vLeavesTemp_local), iVar3 != 5)) {
      pVVar1 = vCover_local;
      if (uVar4 == 7) {
        Vec_IntPush(vCover_local,iVar2);
      }
      else {
        iVar3 = Vec_IntEntry(vLeavesTemp_local,uVar4);
        Vec_IntPush(pVVar1,iVar3);
      }
    }
  }
  _iObjLit1 = Truth >> 0x20 & 0xffff;
  _iObjLit1 = _iObjLit1 << 0x10 | _iObjLit1;
  _iObjLit1 = _iObjLit1 << 0x20 | _iObjLit1;
  iVar3 = Gia_ManFromIfLogicCreateLut
                    ((Gia_Man_t *)pRes_local,(word *)&iObjLit1,vCover_local,vMapping_local,
                     (Vec_Int_t *)z,vMapping2);
  Vec_IntPush(vPacking,2);
  iVar2 = Abc_Lit2Var(iVar2);
  Vec_IntPush(vPacking,iVar2);
  iVar2 = Abc_Lit2Var(iVar3);
  Vec_IntPush(vPacking,iVar2);
  Vec_IntAddToEntry(vPacking,0,1);
  return iVar3;
}

Assistant:

int Gia_ManFromIfLogicCreateLutSpecial( Gia_Man_t * pNew, word * pRes, Vec_Int_t * vLeaves, Vec_Int_t * vLeavesTemp, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking )
{
    word z = If_CutPerformDerive07( NULL, (unsigned *)pRes, Vec_IntSize(vLeaves), Vec_IntSize(vLeaves), NULL );
    word Truth;
    int i, iObjLit1, iObjLit2;
    // create first LUT
    Vec_IntClear( vLeavesTemp );
    for ( i = 0; i < 4; i++ )
    {
        int v = (int)((z >> (16+(i<<2))) & 7);
        if ( v == 6 && Vec_IntSize(vLeaves) == 5 )
            continue;
        Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, v) );
    }
    Truth = (z & 0xffff);
    Truth |= (Truth << 16);
    Truth |= (Truth << 32);
    iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, &Truth, vLeavesTemp, vCover, vMapping, vMapping2 );
    // create second LUT
    Vec_IntClear( vLeavesTemp );
    for ( i = 0; i < 4; i++ )
    {
        int v =  (int)((z >> (48+(i<<2))) & 7);
        if ( v == 6 && Vec_IntSize(vLeaves) == 5 )
            continue;
        if ( v == 7 )
            Vec_IntPush( vLeavesTemp, iObjLit1 );
        else
            Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, v) );
    }
    Truth = ((z >> 32) & 0xffff);
    Truth |= (Truth << 16);
    Truth |= (Truth << 32);
    iObjLit2 = Gia_ManFromIfLogicCreateLut( pNew, &Truth, vLeavesTemp, vCover, vMapping, vMapping2 );
    // write packing
    Vec_IntPush( vPacking, 2 );
    Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
    Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit2) );
    Vec_IntAddToEntry( vPacking, 0, 1 );
    return iObjLit2;
}